

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_bagwell.h
# Opt level: O2

void __thiscall
vector_bagwell<unsigned_long,_16U>::push_back
          (vector_bagwell<unsigned_long,_16U> *this,unsigned_long *t)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  
  if (this->_left_in_block == 0) {
    uVar3 = (ulong)(uint)(0x10 << ((byte)((uint)(*(int *)&(this->_index_block).
                                                                                                                    
                                                  super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                *(int *)&(this->_index_block).
                                                                                                                  
                                                  super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) &
                                  0x1f));
    this->_left_in_block = uVar3;
    puVar2 = (unsigned_long *)malloc(uVar3 << 3);
    this->_insertpos = puVar2;
    std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::push_back
              (&this->_index_block,&this->_insertpos);
  }
  uVar1 = *t;
  puVar2 = this->_insertpos;
  this->_insertpos = puVar2 + 1;
  *puVar2 = uVar1;
  this->_left_in_block = this->_left_in_block - 1;
  return;
}

Assistant:

void push_back(const T& t)
	{
		if (__builtin_expect(current_block_full(), false)) {
			_left_in_block = Initial << _index_block.size();
			_insertpos = static_cast<T*>(
					malloc(_left_in_block*sizeof(T)));
			_index_block.push_back(_insertpos);
		}
		*_insertpos++ = t;
		--_left_in_block;
	}